

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::load_param_bin(Net *this,char *protopath)

{
  FILE *__stream;
  char *in_RSI;
  int ret;
  FILE *fp;
  FILE *in_stack_00000610;
  Net *in_stack_00000618;
  int local_4;
  
  __stream = fopen(in_RSI,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"fopen %s failed\n",in_RSI);
    local_4 = -1;
  }
  else {
    local_4 = load_param_bin(in_stack_00000618,in_stack_00000610);
    fclose(__stream);
  }
  return local_4;
}

Assistant:

int Net::load_param_bin(const char* protopath)
{
    FILE* fp = fopen(protopath, "rb");
    if (!fp)
    {
        fprintf(stderr, "fopen %s failed\n", protopath);
        return -1;
    }

    int ret = load_param_bin(fp);

    fclose(fp);

    return ret;
}